

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strequal.c
# Opt level: O2

int curl_strequal(char *first,char *second)

{
  char cVar1;
  char cVar2;
  long lVar3;
  bool bVar4;
  
  if (second == (char *)0x0 || first == (char *)0x0) {
    bVar4 = first == (char *)0x0 && second == (char *)0x0;
  }
  else {
    for (lVar3 = 0; first[lVar3] != '\0'; lVar3 = lVar3 + 1) {
      cVar1 = Curl_raw_toupper(first[lVar3]);
      cVar2 = Curl_raw_toupper(second[lVar3]);
      if (cVar1 != cVar2) {
        bVar4 = false;
        goto LAB_00156477;
      }
    }
    bVar4 = second[lVar3] == '\0';
  }
LAB_00156477:
  return (int)bVar4;
}

Assistant:

int curl_strequal(const char *first, const char *second)
{
  if(first && second)
    /* both pointers point to something then compare them */
    return casecompare(first, second);

  /* if both pointers are NULL then treat them as equal */
  return NULL == first && NULL == second;
}